

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

char * wasm::getExpressionName(Expression *curr)

{
  Expression *curr_local;
  
  switch(curr->_id) {
  case BlockId:
    curr_local = (Expression *)0x214c6de;
    break;
  case IfId:
    curr_local = (Expression *)0x2121381;
    break;
  case LoopId:
    curr_local = (Expression *)anon_var_dwarf_1e4951a;
    break;
  case BreakId:
    curr_local = (Expression *)0x216310f;
    break;
  case SwitchId:
    curr_local = (Expression *)anon_var_dwarf_1e49532;
    break;
  case CallId:
    curr_local = (Expression *)0x21681c4;
    break;
  case CallIndirectId:
    curr_local = (Expression *)anon_var_dwarf_1e4954a;
    break;
  case LocalGetId:
    curr_local = (Expression *)anon_var_dwarf_1e49556;
    break;
  case LocalSetId:
    curr_local = (Expression *)anon_var_dwarf_1e49562;
    break;
  case GlobalGetId:
    curr_local = (Expression *)anon_var_dwarf_1e4956e;
    break;
  case GlobalSetId:
    curr_local = (Expression *)anon_var_dwarf_1e4957a;
    break;
  case LoadId:
    curr_local = (Expression *)0x2146ea6;
    break;
  case StoreId:
    curr_local = (Expression *)anon_var_dwarf_1e49592;
    break;
  case ConstId:
    curr_local = (Expression *)0x2147030;
    break;
  case UnaryId:
    curr_local = (Expression *)anon_var_dwarf_1e49678;
    break;
  case BinaryId:
    curr_local = (Expression *)0x2163d6f;
    break;
  case SelectId:
    curr_local = (Expression *)anon_var_dwarf_1e49690;
    break;
  case DropId:
    curr_local = (Expression *)0x2146ecc;
    break;
  case ReturnId:
    curr_local = (Expression *)0x20f4c3b;
    break;
  case MemorySizeId:
    curr_local = (Expression *)anon_var_dwarf_1e496b4;
    break;
  case MemoryGrowId:
    curr_local = (Expression *)anon_var_dwarf_1e496c0;
    break;
  case NopId:
    curr_local = (Expression *)anon_var_dwarf_1e494f6;
    break;
  case UnreachableId:
    curr_local = (Expression *)0x2160c3b;
    break;
  case AtomicRMWId:
    curr_local = (Expression *)anon_var_dwarf_1e4959e;
    break;
  case AtomicCmpxchgId:
    curr_local = (Expression *)anon_var_dwarf_1e495aa;
    break;
  case AtomicWaitId:
    curr_local = (Expression *)anon_var_dwarf_1e495b6;
    break;
  case AtomicNotifyId:
    curr_local = (Expression *)anon_var_dwarf_1e495c2;
    break;
  case AtomicFenceId:
    curr_local = (Expression *)anon_var_dwarf_1e495ce;
    break;
  case SIMDExtractId:
    curr_local = (Expression *)anon_var_dwarf_1e495da;
    break;
  case SIMDReplaceId:
    curr_local = (Expression *)anon_var_dwarf_1e495e6;
    break;
  case SIMDShuffleId:
    curr_local = (Expression *)anon_var_dwarf_1e495f2;
    break;
  case SIMDTernaryId:
    curr_local = (Expression *)anon_var_dwarf_1e495fe;
    break;
  case SIMDShiftId:
    curr_local = (Expression *)anon_var_dwarf_1e4960a;
    break;
  case SIMDLoadId:
    curr_local = (Expression *)anon_var_dwarf_1e49616;
    break;
  case SIMDLoadStoreLaneId:
    curr_local = (Expression *)anon_var_dwarf_1e49622;
    break;
  case MemoryInitId:
    curr_local = (Expression *)anon_var_dwarf_1e4963c;
    break;
  case DataDropId:
    curr_local = (Expression *)anon_var_dwarf_1e49648;
    break;
  case MemoryCopyId:
    curr_local = (Expression *)anon_var_dwarf_1e49654;
    break;
  case MemoryFillId:
    curr_local = (Expression *)anon_var_dwarf_1e49660;
    break;
  case PopId:
    curr_local = (Expression *)0x2152b55;
    break;
  case RefNullId:
    curr_local = (Expression *)anon_var_dwarf_1e496e4;
    break;
  case RefIsNullId:
    curr_local = (Expression *)anon_var_dwarf_1e496f0;
    break;
  case RefFuncId:
    curr_local = (Expression *)anon_var_dwarf_1e496fc;
    break;
  case RefEqId:
    curr_local = (Expression *)anon_var_dwarf_1e49708;
    break;
  case TableGetId:
    curr_local = (Expression *)anon_var_dwarf_1e49714;
    break;
  case TableSetId:
    curr_local = (Expression *)anon_var_dwarf_1e49720;
    break;
  case TableSizeId:
    curr_local = (Expression *)anon_var_dwarf_1e4972c;
    break;
  case TableGrowId:
    curr_local = (Expression *)anon_var_dwarf_1e49738;
    break;
  case TryId:
    curr_local = (Expression *)0x21213d7;
    break;
  case ThrowId:
    curr_local = (Expression *)anon_var_dwarf_1e49750;
    break;
  case RethrowId:
    curr_local = (Expression *)anon_var_dwarf_1e4975c;
    break;
  case TupleMakeId:
    curr_local = (Expression *)anon_var_dwarf_1e49768;
    break;
  case TupleExtractId:
    curr_local = (Expression *)anon_var_dwarf_1e49774;
    break;
  case I31NewId:
    curr_local = (Expression *)anon_var_dwarf_1e49780;
    break;
  case I31GetId:
    curr_local = (Expression *)anon_var_dwarf_1e4978c;
    break;
  case CallRefId:
    curr_local = (Expression *)anon_var_dwarf_1e49798;
    break;
  case RefTestId:
    curr_local = (Expression *)anon_var_dwarf_1e497a4;
    break;
  case RefCastId:
    curr_local = (Expression *)anon_var_dwarf_1e497b0;
    break;
  case BrOnId:
    curr_local = (Expression *)anon_var_dwarf_1e497bc;
    break;
  case StructNewId:
    curr_local = (Expression *)anon_var_dwarf_1e497c8;
    break;
  case StructGetId:
    curr_local = (Expression *)anon_var_dwarf_1e497d4;
    break;
  case StructSetId:
    curr_local = (Expression *)anon_var_dwarf_1e497e0;
    break;
  case ArrayNewId:
    curr_local = (Expression *)anon_var_dwarf_1e497ec;
    break;
  case ArrayNewSegId:
    curr_local = (Expression *)anon_var_dwarf_1e497f8;
    break;
  case ArrayNewFixedId:
    curr_local = (Expression *)anon_var_dwarf_1e49804;
    break;
  case ArrayGetId:
    curr_local = (Expression *)anon_var_dwarf_1e49810;
    break;
  case ArraySetId:
    curr_local = (Expression *)anon_var_dwarf_1e4981c;
    break;
  case ArrayLenId:
    curr_local = (Expression *)anon_var_dwarf_1e49828;
    break;
  case ArrayCopyId:
    curr_local = (Expression *)anon_var_dwarf_1e49834;
    break;
  case ArrayFillId:
    curr_local = (Expression *)anon_var_dwarf_1e49840;
    break;
  case ArrayInitId:
    curr_local = (Expression *)anon_var_dwarf_1e4984c;
    break;
  case RefAsId:
    curr_local = (Expression *)anon_var_dwarf_1e49858;
    break;
  case StringNewId:
    curr_local = (Expression *)anon_var_dwarf_1e49864;
    break;
  case StringConstId:
    curr_local = (Expression *)anon_var_dwarf_1e49870;
    break;
  case StringMeasureId:
    curr_local = (Expression *)anon_var_dwarf_1e4987c;
    break;
  case StringEncodeId:
    curr_local = (Expression *)anon_var_dwarf_1e49888;
    break;
  case StringConcatId:
    curr_local = (Expression *)anon_var_dwarf_1e49894;
    break;
  case StringEqId:
    curr_local = (Expression *)anon_var_dwarf_1e498a0;
    break;
  case StringAsId:
    curr_local = (Expression *)anon_var_dwarf_1e498ac;
    break;
  case StringWTF8AdvanceId:
    curr_local = (Expression *)anon_var_dwarf_1e498b8;
    break;
  case StringWTF16GetId:
    curr_local = (Expression *)anon_var_dwarf_1e498c4;
    break;
  case StringIterNextId:
    curr_local = (Expression *)anon_var_dwarf_1e498d0;
    break;
  case StringIterMoveId:
    curr_local = (Expression *)anon_var_dwarf_1e498dc;
    break;
  case StringSliceWTFId:
    curr_local = (Expression *)anon_var_dwarf_1e498e8;
    break;
  case StringSliceIterId:
    curr_local = (Expression *)anon_var_dwarf_1e498f4;
    break;
  default:
    handle_unreachable("invalid id",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm.cpp"
                       ,0x72);
  }
  return (char *)curr_local;
}

Assistant:

const char* getExpressionName(Expression* curr) {
  switch (curr->_id) {

#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return #CLASS_TO_VISIT;

#include "wasm-delegations.def"

    default:
      WASM_UNREACHABLE("invalid id");
  }
}